

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * __thiscall
units::probeUnit_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,
          pair<units::precise_unit,_const_char_*> *probe)

{
  unit uVar1;
  long lVar2;
  unit_data uVar3;
  long *plVar4;
  unit *puVar5;
  string *extraout_RAX;
  string *psVar6;
  size_type *psVar7;
  long *plVar8;
  unit uVar9;
  undefined8 uVar10;
  precise_unit pVar11;
  __string_type __str;
  string fnd;
  unit in_stack_ffffffffffffff18;
  unit uVar12;
  ulong local_e0;
  long local_d8;
  unit uStack_d0;
  double local_c8;
  string *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  long local_90;
  unit uStack_88;
  double local_80;
  undefined8 local_78;
  long *local_70;
  ulong local_68;
  long local_60;
  long lStack_58;
  unit local_50 [2];
  long local_40 [2];
  
  local_c8 = *(double *)this * un->multiplier_;
  uVar3 = detail::unit_data::operator*((unit_data *)(this + 8),&un->base_units_);
  local_78 = CONCAT44(un->commodity_ | *(uint *)(this + 0xc),uVar3);
  local_80 = local_c8;
  find_unit_abi_cxx11_(in_stack_ffffffffffffff18);
  if (local_b8 == 0) {
    detail::unit_data::inv((unit_data *)&local_78);
    find_unit_abi_cxx11_(in_stack_ffffffffffffff18);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&stack0xffffffffffffff18);
    if (in_stack_ffffffffffffff18 != (unit)&local_d8) {
      operator_delete((void *)in_stack_ffffffffffffff18,local_d8 + 1);
    }
    if (local_b8 == 0) {
      pVar11 = precise_unit::operator/((precise_unit *)this,un);
      local_78 = pVar11._8_8_;
      local_80 = pVar11.multiplier_;
      find_unit_abi_cxx11_(in_stack_ffffffffffffff18);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&stack0xffffffffffffff18);
      if (in_stack_ffffffffffffff18 != (unit)&local_d8) {
        operator_delete((void *)in_stack_ffffffffffffff18,local_d8 + 1);
      }
      if (local_b8 == 0) {
        local_c8 = local_80;
        detail::unit_data::inv((unit_data *)&local_78);
        find_unit_abi_cxx11_(in_stack_ffffffffffffff18);
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&stack0xffffffffffffff18);
        if (in_stack_ffffffffffffff18 != (unit)&local_d8) {
          operator_delete((void *)in_stack_ffffffffffffff18,local_d8 + 1);
        }
        if (local_b8 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          goto LAB_00169ada;
        }
        std::__cxx11::string::string
                  ((string *)(local_b0 + 0x10),(char *)un[1].multiplier_,(allocator *)&local_70);
        puVar5 = (unit *)std::__cxx11::string::_M_replace_aux
                                   ((ulong)(local_b0 + 0x10),local_a0._8_8_,0,'\x01');
        uVar9 = (unit)(puVar5 + 2);
        if (*puVar5 == uVar9) {
          local_d8 = *(long *)uVar9;
          uStack_d0 = puVar5[3];
          uVar12 = (unit)&local_d8;
        }
        else {
          local_d8 = *(long *)uVar9;
          uVar12 = *puVar5;
        }
        *puVar5 = uVar9;
        puVar5[1].multiplier_ = 0.0;
        puVar5[1].base_units_ = (unit_data)0x0;
        *(undefined1 *)&puVar5[2].multiplier_ = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append(&stack0xffffffffffffff18,(ulong)local_c0);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar7 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar7) {
          lVar2 = plVar4[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        }
        __return_storage_ptr__->_M_string_length = plVar4[1];
        *plVar4 = (long)psVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if (uVar12 != (unit)&local_d8) {
          operator_delete((void *)uVar12,local_d8 + 1);
        }
        local_40[0] = local_90;
        uVar10 = local_a0._M_allocated_capacity;
        if ((long *)local_a0._M_allocated_capacity == &local_90) goto LAB_00169ada;
      }
      else {
        uVar10 = &local_d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xffffffffffffff18,local_c0,
                   (long)&(local_c0->_M_dataplus)._M_p + local_b8);
        std::__cxx11::string::_M_replace_aux((ulong)&stack0xffffffffffffff18,local_e0,0,'\x01');
        plVar4 = (long *)std::__cxx11::string::append(&stack0xffffffffffffff18);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar7 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar7) {
          lVar2 = plVar4[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        }
        __return_storage_ptr__->_M_string_length = plVar4[1];
        *plVar4 = (long)psVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        local_40[0] = local_d8;
        if ((long *)uVar10 == &local_d8) goto LAB_00169ada;
      }
    }
    else {
      local_50[0] = (unit)local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"1/(","");
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_c0);
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_60 = *plVar8;
        lStack_58 = plVar4[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar8;
        local_70 = (long *)*plVar4;
      }
      local_68 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar5 = (unit *)std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
      uVar9 = (unit)(puVar5 + 2);
      if (*puVar5 == uVar9) {
        local_90 = *(long *)uVar9;
        uStack_88 = puVar5[3];
        local_a0._M_allocated_capacity = (size_type)&local_90;
      }
      else {
        local_90 = *(long *)uVar9;
        local_a0._M_allocated_capacity = (size_type)*puVar5;
      }
      local_a0._8_8_ = puVar5[1];
      *puVar5 = uVar9;
      puVar5[1].multiplier_ = 0.0;
      puVar5[1].base_units_ = (unit_data)0x0;
      *(undefined1 *)&puVar5[2].multiplier_ = 0;
      puVar5 = (unit *)std::__cxx11::string::append(local_b0 + 0x10);
      uVar9 = (unit)(puVar5 + 2);
      if (*puVar5 == uVar9) {
        local_d8 = *(long *)uVar9;
        uStack_d0 = puVar5[3];
        uVar12 = (unit)&local_d8;
      }
      else {
        local_d8 = *(long *)uVar9;
        uVar12 = *puVar5;
      }
      uVar1 = puVar5[1];
      *puVar5 = uVar9;
      puVar5[1].multiplier_ = 0.0;
      puVar5[1].base_units_ = (unit_data)0x0;
      *(undefined1 *)&puVar5[2].multiplier_ = 0;
      plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                                 ((ulong)&stack0xffffffffffffff18,(ulong)uVar1,0,'\x01');
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar7) {
        lVar2 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (uVar12 != (unit)&local_d8) {
        operator_delete((void *)uVar12,local_d8 + 1);
      }
      if ((long *)local_a0._M_allocated_capacity != &local_90) {
        operator_delete((void *)local_a0._M_allocated_capacity,local_90 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      uVar10 = local_50[0];
      if (local_50[0] == (unit)local_40) goto LAB_00169ada;
    }
  }
  else {
    uVar10 = &local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff18,local_c0,
               (long)&(local_c0->_M_dataplus)._M_p + local_b8);
    std::__cxx11::string::_M_replace_aux((ulong)&stack0xffffffffffffff18,local_e0,0,'\x01');
    plVar4 = (long *)std::__cxx11::string::append(&stack0xffffffffffffff18);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar7) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_40[0] = local_d8;
    if ((long *)uVar10 == &local_d8) goto LAB_00169ada;
  }
  operator_delete((void *)uVar10,local_40[0] + 1);
LAB_00169ada:
  psVar6 = (string *)local_b0;
  if (local_c0 != psVar6) {
    operator_delete(local_c0,(ulong)(local_b0._0_8_ + 1));
    psVar6 = extraout_RAX;
  }
  return psVar6;
}

Assistant:

static std::string probeUnit(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    // let's try common divisor units
    auto ext = un * probe.first;
    auto fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '/' + probe.second;
    }
    // let's try inverse of common multiplier units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string("1/(") + fnd + '*' + probe.second + ')';
    }

    // let's try common multiplier units
    ext = un / probe.first;
    fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '*' + probe.second;
    }
    // let's try common divisor with inv units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string(probe.second) + '/' + fnd;
    }
    return std::string{};
}